

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,AlphaNum *f,AlphaNum *g,AlphaNum *h,AlphaNum *i)

{
  char *out;
  char *pcVar1;
  LogMessage *other;
  LogFinisher local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  AlphaNum *local_70;
  LogMessage local_68;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70 = d;
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)a->piece_size_ + (char)*(undefined8 *)(this + 8) + (char)b->piece_size_ +
             (char)c->piece_size_ + (char)d->piece_size_ + (char)e->piece_size_ +
             (char)f->piece_size_ + (char)g->piece_size_ + (char)h->piece_size_);
  out = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar1 = Append4(out,(AlphaNum *)this,a,b,c);
  pcVar1 = Append4(pcVar1,local_70,e,f,g);
  if (h->piece_size_ != 0) {
    memcpy(pcVar1,h->piece_data_,h->piece_size_);
    pcVar1 = pcVar1 + h->piece_size_;
  }
  if (pcVar1 != out + __return_storage_ptr__->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x619);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_79,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
                   const AlphaNum &d, const AlphaNum &e, const AlphaNum &f,
                   const AlphaNum &g, const AlphaNum &h, const AlphaNum &i) {
  std::string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size() +
                f.size() + g.size() + h.size() + i.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append4(out, e, f, g, h);
  out = Append1(out, i);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}